

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_file_async(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar1 = uv_fs_open(loop,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (create_cb_count == 1) {
      if (write_cb_count == 1) {
        if (fsync_cb_count == 1) {
          if (fdatasync_cb_count == 1) {
            if (close_cb_count == 1) {
              iVar1 = uv_fs_rename(loop,&rename_req,"test_file","test_file2",rename_cb);
              if (iVar1 == 0) {
                uv_run(loop,UV_RUN_DEFAULT);
                if (create_cb_count == 1) {
                  if (write_cb_count == 1) {
                    if (close_cb_count == 1) {
                      if (rename_cb_count == 1) {
                        iVar1 = uv_fs_open(loop,&open_req1,"test_file2",2,0,open_cb);
                        if (iVar1 == 0) {
                          uv_run(loop,UV_RUN_DEFAULT);
                          if (open_cb_count == 1) {
                            if (read_cb_count == 1) {
                              if (close_cb_count == 2) {
                                if (rename_cb_count == 1) {
                                  if (create_cb_count == 1) {
                                    if (write_cb_count == 1) {
                                      if (ftruncate_cb_count == 1) {
                                        iVar1 = uv_fs_open(loop,&open_req1,"test_file2",0,0,open_cb)
                                        ;
                                        if (iVar1 == 0) {
                                          uv_run(loop,UV_RUN_DEFAULT);
                                          if (open_cb_count == 2) {
                                            if (read_cb_count == 2) {
                                              if (close_cb_count == 3) {
                                                if (rename_cb_count == 1) {
                                                  if (unlink_cb_count == 1) {
                                                    if (create_cb_count == 1) {
                                                      if (write_cb_count == 1) {
                                                        if (ftruncate_cb_count == 1) {
                                                          unlink("test_file");
                                                          unlink("test_file2");
                                                          puVar2 = uv_default_loop();
                                                          close_loop(puVar2);
                                                          puVar2 = uv_default_loop();
                                                          iVar1 = uv_loop_close(puVar2);
                                                          if (iVar1 == 0) {
                                                            return 0;
                                                          }
                                                          pcVar4 = 
                                                  "0 == uv_loop_close(uv_default_loop())";
                                                  uVar3 = 0x393;
                                                  }
                                                  else {
                                                    pcVar4 = "ftruncate_cb_count == 1";
                                                    uVar3 = 0x38d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "write_cb_count == 1";
                                                    uVar3 = 0x38c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "create_cb_count == 1";
                                                    uVar3 = 0x38b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "unlink_cb_count == 1";
                                                    uVar3 = 0x38a;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "rename_cb_count == 1";
                                                  uVar3 = 0x389;
                                                }
                                              }
                                              else {
                                                pcVar4 = "close_cb_count == 3";
                                                uVar3 = 0x388;
                                              }
                                            }
                                            else {
                                              pcVar4 = "read_cb_count == 2";
                                              uVar3 = 0x387;
                                            }
                                          }
                                          else {
                                            pcVar4 = "open_cb_count == 2";
                                            uVar3 = 0x386;
                                          }
                                        }
                                        else {
                                          pcVar4 = "r == 0";
                                          uVar3 = 899;
                                        }
                                      }
                                      else {
                                        pcVar4 = "ftruncate_cb_count == 1";
                                        uVar3 = 0x380;
                                      }
                                    }
                                    else {
                                      pcVar4 = "write_cb_count == 1";
                                      uVar3 = 0x37f;
                                    }
                                  }
                                  else {
                                    pcVar4 = "create_cb_count == 1";
                                    uVar3 = 0x37e;
                                  }
                                }
                                else {
                                  pcVar4 = "rename_cb_count == 1";
                                  uVar3 = 0x37d;
                                }
                              }
                              else {
                                pcVar4 = "close_cb_count == 2";
                                uVar3 = 0x37c;
                              }
                            }
                            else {
                              pcVar4 = "read_cb_count == 1";
                              uVar3 = 0x37b;
                            }
                          }
                          else {
                            pcVar4 = "open_cb_count == 1";
                            uVar3 = 0x37a;
                          }
                        }
                        else {
                          pcVar4 = "r == 0";
                          uVar3 = 0x377;
                        }
                      }
                      else {
                        pcVar4 = "rename_cb_count == 1";
                        uVar3 = 0x374;
                      }
                    }
                    else {
                      pcVar4 = "close_cb_count == 1";
                      uVar3 = 0x373;
                    }
                  }
                  else {
                    pcVar4 = "write_cb_count == 1";
                    uVar3 = 0x372;
                  }
                }
                else {
                  pcVar4 = "create_cb_count == 1";
                  uVar3 = 0x371;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0x36e;
              }
            }
            else {
              pcVar4 = "close_cb_count == 1";
              uVar3 = 0x36b;
            }
          }
          else {
            pcVar4 = "fdatasync_cb_count == 1";
            uVar3 = 0x36a;
          }
        }
        else {
          pcVar4 = "fsync_cb_count == 1";
          uVar3 = 0x369;
        }
      }
      else {
        pcVar4 = "write_cb_count == 1";
        uVar3 = 0x368;
      }
    }
    else {
      pcVar4 = "create_cb_count == 1";
      uVar3 = 0x367;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x364;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_file_async) {
  int r;

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  loop = uv_default_loop();

  r = uv_fs_open(loop, &open_req1, "test_file", O_WRONLY | O_CREAT,
      S_IRUSR | S_IWUSR, create_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(fsync_cb_count == 1);
  ASSERT(fdatasync_cb_count == 1);
  ASSERT(close_cb_count == 1);

  r = uv_fs_rename(loop, &rename_req, "test_file", "test_file2", rename_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(close_cb_count == 1);
  ASSERT(rename_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDWR, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);
  ASSERT(read_cb_count == 1);
  ASSERT(close_cb_count == 2);
  ASSERT(rename_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDONLY, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 2);
  ASSERT(read_cb_count == 2);
  ASSERT(close_cb_count == 3);
  ASSERT(rename_cb_count == 1);
  ASSERT(unlink_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}